

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::DescriptorDatabaseTest_FindAllExtensionNumbers_Test::TestBody
          (DescriptorDatabaseTest_FindAllExtensionNumbers_Test *this)

{
  DescriptorDatabase *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  iterator __first;
  reference pvVar5;
  char *in_R9;
  string local_330;
  AssertHelper local_310;
  Message local_308;
  allocator<char> local_2f9;
  string local_2f8 [39];
  bool local_2d1;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar__3;
  vector<int,_std::allocator<int>_> numbers_3;
  AssertHelper local_288;
  Message local_280;
  allocator<char> local_271;
  string local_270 [39];
  bool local_249;
  undefined1 local_248 [8];
  AssertionResult gtest_ar__2;
  vector<int,_std::allocator<int>_> numbers_2;
  Message local_218;
  int local_20c;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_4;
  Message local_1f0;
  size_type local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_1a8;
  Message local_1a0;
  allocator<char> local_191;
  string local_190 [39];
  bool local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar__1;
  vector<int,_std::allocator<int>_> numbers_1;
  Message local_138;
  int local_12c;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_2;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_d8;
  Message local_d0;
  size_type local_c8;
  int local_bc;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_88;
  Message local_80 [3];
  allocator<char> local_61;
  string local_60 [39];
  bool local_39;
  undefined1 local_38 [8];
  AssertionResult gtest_ar_;
  vector<int,_std::allocator<int>_> numbers;
  DescriptorDatabaseTest_FindAllExtensionNumbers_Test *this_local;
  
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"foo.proto\" message_type {   name: \"Foo\"   extension_range { start: 1 end: 1000 }   extension { name:\"qux\" label:LABEL_OPTIONAL type:TYPE_INT32 number:5               extendee: \".Foo\" }}"
            );
  DescriptorDatabaseTest::AddToDatabase
            (&this->super_DescriptorDatabaseTest,
             "name: \"bar.proto\" package: \"corge\" dependency: \"foo.proto\" message_type {   name: \"Bar\"   extension_range { start: 1 end: 1000 } } extension { name:\"grault\" extendee: \".Foo\"       number:32 } extension { name:\"garply\" extendee: \".corge.Bar\" number:70 } extension { name:\"waldo\"  extendee: \"Bar\"        number:56 } "
            );
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_.message_);
  pDVar1 = (this->super_DescriptorDatabaseTest).database_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"Foo",&local_61);
  iVar3 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_60,&gtest_ar_.message_);
  local_39 = (bool)((byte)iVar3 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_38,&local_39,(type *)0x0)
  ;
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator(&local_61);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar2) {
    testing::Message::Message(local_80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_38,
               (AssertionResult *)"database_->FindAllExtensionNumbers(\"Foo\", &numbers)","false",
               "true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x17f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_88,local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  local_bc = 2;
  local_c8 = std::vector<int,_std::allocator<int>_>::size
                       ((vector<int,_std::allocator<int>_> *)&gtest_ar_.message_);
  testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
            ((EqHelper *)local_b8,"2","numbers.size()",&local_bc,&local_c8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar2) {
    testing::Message::Message(&local_d0);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_d8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x180,pcVar4);
    testing::internal::AssertHelper::operator=(&local_d8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_d8);
    testing::Message::~Message(&local_d0);
  }
  bVar2 = !bVar2;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  if (!bVar2) {
    __first = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&gtest_ar_.message_);
    gtest_ar_1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)&gtest_ar_.message_);
    std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)__first._M_current
               ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                gtest_ar_1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl);
    local_104 = 5;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&gtest_ar_.message_,0);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_100,"5","numbers[0]",&local_104,pvVar5);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
    if (!bVar2) {
      testing::Message::Message(&local_110);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x182,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_110);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_110);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
    local_12c = 0x20;
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)&gtest_ar_.message_,1);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_128,"32","numbers[1]",&local_12c,pvVar5);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
    if (!bVar2) {
      testing::Message::Message(&local_138);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_128);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)
                 &numbers_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x183,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)
                 &numbers_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_138);
      testing::internal::AssertHelper::~AssertHelper
                ((AssertHelper *)
                 &numbers_1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_138);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
    bVar2 = false;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_.message_);
  if (!bVar2) {
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&gtest_ar__1.message_);
    pDVar1 = (this->super_DescriptorDatabaseTest).database_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_190,"corge.Bar",&local_191);
    iVar3 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_190,&gtest_ar__1.message_);
    local_169 = (bool)((byte)iVar3 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_168,&local_169,(type *)0x0);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator(&local_191);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
    if (!bVar2) {
      testing::Message::Message(&local_1a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_3.message_,(internal *)local_168,
                 (AssertionResult *)"database_->FindAllExtensionNumbers(\"corge.Bar\", &numbers)",
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1a8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x188,pcVar4);
      testing::internal::AssertHelper::operator=(&local_1a8,&local_1a0);
      testing::internal::AssertHelper::~AssertHelper(&local_1a8);
      std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
      testing::Message::~Message(&local_1a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
    local_1dc = 1;
    local_1e8 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&gtest_ar__1.message_);
    testing::internal::EqHelper::Compare<int,_unsigned_long,_nullptr>
              ((EqHelper *)local_1d8,"1","numbers.size()",&local_1dc,&local_1e8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar2) {
      testing::Message::Message(&local_1f0);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                 ,0x18a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_1f0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
      testing::Message::~Message(&local_1f0);
    }
    bVar2 = !bVar2;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    if (!bVar2) {
      local_20c = 0x46;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&gtest_ar__1.message_,0);
      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                ((EqHelper *)local_208,"70","numbers[0]",&local_20c,pvVar5);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
      if (!bVar2) {
        testing::Message::Message(&local_218);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_208);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)
                   &numbers_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                   ,0x18b,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)
                   &numbers_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,&local_218);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)
                   &numbers_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_218);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
      bVar2 = false;
    }
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)&gtest_ar__1.message_);
    if (!bVar2) {
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&gtest_ar__2.message_);
      pDVar1 = (this->super_DescriptorDatabaseTest).database_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_270,"NoSuchType",&local_271);
      iVar3 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_270,&gtest_ar__2.message_);
      local_249 = (bool)(~(byte)iVar3 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_248,&local_249,(type *)0x0);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator(&local_271);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_248);
      if (!bVar2) {
        testing::Message::Message(&local_280);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &numbers_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(internal *)local_248,
                   (AssertionResult *)"database_->FindAllExtensionNumbers(\"NoSuchType\", &numbers)"
                   ,"true","false",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_288,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                   ,0x191,pcVar4);
        testing::internal::AssertHelper::operator=(&local_288,&local_280);
        testing::internal::AssertHelper::~AssertHelper(&local_288);
        std::__cxx11::string::~string
                  ((string *)
                   &numbers_3.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_280);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_248);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&gtest_ar__2.message_);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&gtest_ar__3.message_);
      pDVar1 = (this->super_DescriptorDatabaseTest).database_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2f8,"Bar",&local_2f9);
      iVar3 = (*pDVar1->_vptr_DescriptorDatabase[5])(pDVar1,local_2f8,&gtest_ar__3.message_);
      local_2d1 = (bool)(~(byte)iVar3 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_2d0,&local_2d1,(type *)0x0);
      std::__cxx11::string::~string(local_2f8);
      std::allocator<char>::~allocator(&local_2f9);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d0);
      if (!bVar2) {
        testing::Message::Message(&local_308);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_330,(internal *)local_2d0,
                   (AssertionResult *)"database_->FindAllExtensionNumbers(\"Bar\", &numbers)","true"
                   ,"false",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_310,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
                   ,0x197,pcVar4);
        testing::internal::AssertHelper::operator=(&local_310,&local_308);
        testing::internal::AssertHelper::~AssertHelper(&local_310);
        std::__cxx11::string::~string((string *)&local_330);
        testing::Message::~Message(&local_308);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&gtest_ar__3.message_);
    }
  }
  return;
}

Assistant:

TEST_P(DescriptorDatabaseTest, FindAllExtensionNumbers) {
  AddToDatabase(
      "name: \"foo.proto\" "
      "message_type { "
      "  name: \"Foo\" "
      "  extension_range { start: 1 end: 1000 } "
      "  extension { name:\"qux\" label:LABEL_OPTIONAL type:TYPE_INT32 "
      "number:5 "
      "              extendee: \".Foo\" }"
      "}");
  AddToDatabase(
      "name: \"bar.proto\" "
      "package: \"corge\" "
      "dependency: \"foo.proto\" "
      "message_type { "
      "  name: \"Bar\" "
      "  extension_range { start: 1 end: 1000 } "
      "} "
      "extension { name:\"grault\" extendee: \".Foo\"       number:32 } "
      "extension { name:\"garply\" extendee: \".corge.Bar\" number:70 } "
      "extension { name:\"waldo\"  extendee: \"Bar\"        number:56 } ");

  {
    std::vector<int> numbers;
    EXPECT_TRUE(database_->FindAllExtensionNumbers("Foo", &numbers));
    ASSERT_EQ(2, numbers.size());
    std::sort(numbers.begin(), numbers.end());
    EXPECT_EQ(5, numbers[0]);
    EXPECT_EQ(32, numbers[1]);
  }

  {
    std::vector<int> numbers;
    EXPECT_TRUE(database_->FindAllExtensionNumbers("corge.Bar", &numbers));
    // Note: won't find extension 56 due to the name not being fully qualified.
    ASSERT_EQ(1, numbers.size());
    EXPECT_EQ(70, numbers[0]);
  }

  {
    // Can't find extensions for non-existent types.
    std::vector<int> numbers;
    EXPECT_FALSE(database_->FindAllExtensionNumbers("NoSuchType", &numbers));
  }

  {
    // Can't find extensions for unqualified types.
    std::vector<int> numbers;
    EXPECT_FALSE(database_->FindAllExtensionNumbers("Bar", &numbers));
  }
}